

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O3

uvec4 ImageCodec::decodeUINT_UINTVec<unsigned_char,2>(ImageCodec *param_1,void *ptr)

{
  uvec4 uVar1;
  
  uVar1.field_0._0_8_ = (ulong)*(byte *)((long)ptr + 1) << 0x20 | (ulong)*ptr;
  uVar1.field_0._8_8_ = 0;
  return (uvec4)uVar1.field_0;
}

Assistant:

static glm::uvec4 decodeUINT_UINTVec(const ImageCodec*, const void* ptr) {
        static_assert(std::is_unsigned_v<TYPE>);
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const TYPE*>(ptr);
        glm::uvec4 result(0, 0, 0, 0);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = data[i];
        return result;
    }